

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeScale(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  pointer plVar7;
  int iVar8;
  Type *caffeLayer;
  Type *pTVar9;
  Type *pTVar10;
  Type *pTVar11;
  BlobShape *pBVar12;
  BiasLayerParams *this;
  int64 iVar13;
  NeuralNetworkLayer *pNVar14;
  ScaleLayerParams *this_00;
  WeightParams *pWVar15;
  ScaleParameter *pSVar16;
  uint64 *puVar17;
  byte bVar18;
  RepeatedPtrField<caffe::BlobProto> *pRVar19;
  uint index;
  int new_size;
  bool bVar20;
  allocator local_111;
  string local_110;
  allocator local_e9;
  ulong local_e8;
  int local_dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  topMulLayer;
  vector<long,_std::allocator<long>_> biasShape;
  vector<long,_std::allocator<long>_> scaleShape;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                          *layerParameters.layerId);
  iVar8 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar8);
  pSVar16 = caffeLayer->scale_param_;
  if (pSVar16 == (ScaleParameter *)0x0) {
    pSVar16 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
  }
  if (1 < (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ - 1U) {
    std::__cxx11::string::string
              ((string *)&local_110,"Must have 1 or 2 input(s)",(allocator *)&topMulLayer);
    errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    std::__cxx11::string::string
              ((string *)&local_110,"Must have 1 output",(allocator *)&topMulLayer);
    errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_110);
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(caffeLayer->top_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,pTVar10);
  local_dc = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  bVar1 = pSVar16->bias_term_;
  bVar20 = local_dc == 1;
  if ((bVar20) && (bVar1 == false)) {
    if ((pTVar9->blobs_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      iVar8 = 1;
    }
    else {
LAB_00477a9c:
      std::__cxx11::string::string
                ((string *)&local_110,"There must be 1 weight blob",(allocator *)&topMulLayer);
      errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_110);
      iVar8 = (pTVar9->blobs_).super_RepeatedPtrFieldBase.current_size_;
    }
  }
  else {
    iVar8 = (pTVar9->blobs_).super_RepeatedPtrFieldBase.current_size_;
    if ((local_dc == 2) && ((bVar1 != false && (iVar8 != 1)))) goto LAB_00477a9c;
  }
  if ((bVar20 && bVar1 == true) && (iVar8 != 2)) {
    std::__cxx11::string::string
              ((string *)&local_110,"There must be 2 weight blobs",(allocator *)&topMulLayer);
    errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_110);
  }
  iVar8 = pSVar16->axis_;
  if ((iVar8 + 4U < 8) && ((0x99U >> (iVar8 + 4U & 0x1f) & 1) != 0)) {
    std::__cxx11::string::string((string *)&local_110,"axis",(allocator *)&biasShape);
    psVar2 = (caffeLayer->name_).ptr_;
    psVar3 = (caffeLayer->type_).ptr_;
    std::__cxx11::to_string((string *)&topMulLayer,pSVar16->axis_);
    unsupportedCaffeParrameterWithOption(&local_110,psVar2,psVar3,(string *)&topMulLayer);
    std::__cxx11::string::~string((string *)&topMulLayer);
    std::__cxx11::string::~string((string *)&local_110);
    iVar8 = pSVar16->axis_;
  }
  bVar18 = bVar20 & bVar1;
  bVar6 = bVar1;
  if (iVar8 == 1) {
    if (local_dc == 1) {
LAB_00477bbb:
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar9->blobs_).super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar12->dim_).current_size_ == 2) {
        std::__cxx11::string::string
                  ((string *)&local_110,"Scale of size 2D when axis = 1 is currently not supported",
                   (allocator *)&topMulLayer);
        errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        std::__cxx11::string::~string((string *)&local_110);
      }
      iVar8 = pSVar16->axis_;
      if (iVar8 != 1) goto LAB_00477c25;
    }
  }
  else {
    if ((local_dc == 1) && (iVar8 == -3)) goto LAB_00477bbb;
LAB_00477c25:
    bVar6 = bVar1 & iVar8 == -3;
  }
  if (bVar6 != 0) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&(pTVar9->blobs_).super_RepeatedPtrFieldBase,(uint)bVar18);
    pBVar12 = pTVar11->shape_;
    if (pBVar12 == (BlobShape *)0x0) {
      pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    if ((pBVar12->dim_).current_size_ == 2) {
      std::__cxx11::string::string
                ((string *)&local_110,"Bias of size 2D when axis = 1 is currently not supported",
                 (allocator *)&topMulLayer);
      errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  iVar8 = pSVar16->axis_;
  if (iVar8 == 2) {
    if (local_dc == 1) {
LAB_00477cac:
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar9->blobs_).super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar12->dim_).current_size_ == 1) {
        std::__cxx11::string::string
                  ((string *)&local_110,"Scale of size 1D when axis = 2 is currently not supported",
                   (allocator *)&topMulLayer);
        errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        std::__cxx11::string::~string((string *)&local_110);
      }
      iVar8 = pSVar16->axis_;
      if (iVar8 != 2) goto LAB_00477d2a;
    }
    if (bVar1 != false) {
LAB_00477d36:
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar9->blobs_).super_RepeatedPtrFieldBase,(uint)bVar18);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      if ((pBVar12->dim_).current_size_ == 1) {
        std::__cxx11::string::string
                  ((string *)&local_110,"Bias of size 1D when axis = 2 is currently not supported",
                   (allocator *)&topMulLayer);
        errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
        std::__cxx11::string::~string((string *)&local_110);
      }
      goto LAB_00477d90;
    }
LAB_00477e7f:
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8 = 1;
  }
  else {
    if ((local_dc == 1) && (iVar8 == -2)) goto LAB_00477cac;
LAB_00477d2a:
    if ((bVar1 & iVar8 == -2) != 0) goto LAB_00477d36;
LAB_00477d90:
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (bVar1 == false) goto LAB_00477e7f;
    pRVar19 = &pTVar9->blobs_;
    index = (uint)bVar18;
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
    pBVar12 = pTVar11->shape_;
    if (pBVar12 == (BlobShape *)0x0) {
      pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    iVar8 = (pBVar12->dim_).current_size_;
    local_e8 = 1;
    if (iVar8 != 0) {
      if (iVar8 == 1) {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,index);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,0);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = (ulong)*(uint *)(biasShape.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + -1);
      }
      else if (iVar8 == 2) {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,0);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,1);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = (ulong)(uint)((int)local_e8 *
                                (int)biasShape.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish[-1]);
      }
      else if (iVar8 - 3U < 2) {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,index);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 - 3U);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,index);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 + -2);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = local_e8 *
                   biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 + -1);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&biasShape,(long *)&local_110);
        local_e8 = (ulong)(uint)((int)local_e8 *
                                (int)biasShape.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish[-1]);
        if (iVar8 == 4) {
          pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
          pBVar12 = pTVar11->shape_;
          if (pBVar12 == (BlobShape *)0x0) {
            pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
          }
          iVar13 = caffe::BlobShape::dim(pBVar12,0);
          if (iVar13 != 1) {
            std::__cxx11::string::string((string *)&local_110,"bias",(allocator *)&scaleShape);
            psVar2 = (caffeLayer->name_).ptr_;
            psVar3 = (caffeLayer->type_).ptr_;
            std::__cxx11::string::string
                      ((string *)&topMulLayer,"4D bias only supported when 1st dimension is 1",
                       &local_111);
            unsupportedCaffeParrameterWithOption(&local_110,psVar2,psVar3,(string *)&topMulLayer);
            goto LAB_0047808f;
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_110,"bias",(allocator *)&scaleShape);
        psVar2 = (caffeLayer->name_).ptr_;
        psVar3 = (caffeLayer->type_).ptr_;
        std::__cxx11::string::string((string *)&topMulLayer,">4D bias not supported",&local_111);
        unsupportedCaffeParrameterWithOption(&local_110,psVar2,psVar3,(string *)&topMulLayer);
LAB_0047808f:
        std::__cxx11::string::~string((string *)&topMulLayer);
        std::__cxx11::string::~string((string *)&local_110);
      }
    }
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&pRVar19->super_RepeatedPtrFieldBase,(uint)bVar18);
    if ((pTVar11->data_).current_size_ != (int)local_e8) {
      std::__cxx11::string::string
                ((string *)&local_110,"Bias blob data inconsistent with the blob dimensions",
                 (allocator *)&topMulLayer);
      errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_dc != 1) {
    if (bVar1 == false) {
      pNVar14 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (layerParameters.nnWrite);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&bottom,pTVar10);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&bottom,pTVar10);
      std::operator+(&local_110,(caffeLayer->name_).ptr_,"_Mul");
      convertCaffeMetadata
                (&local_110,&bottom,&top,layerParameters.nnWrite,
                 layerParameters.mappingDataBlobNames);
      std::__cxx11::string::~string((string *)&local_110);
      CoreML::Specification::NeuralNetworkLayer::mutable_multiply(pNVar14);
    }
    else {
      pNVar14 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (layerParameters.nnWrite);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&bottom,pTVar10);
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&bottom,pTVar10);
      topMulLayer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      topMulLayer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      topMulLayer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::operator+(&local_110,(caffeLayer->name_).ptr_,"_Mul_output");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&topMulLayer,
                 &local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::operator+(&local_110,(caffeLayer->name_).ptr_,"_Mul");
      convertCaffeMetadata
                (&local_110,&bottom,&topMulLayer,layerParameters.nnWrite,
                 layerParameters.mappingDataBlobNames);
      std::__cxx11::string::~string((string *)&local_110);
      CoreML::Specification::NeuralNetworkLayer::mutable_multiply(pNVar14);
      pNVar14 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (layerParameters.nnWrite);
      std::operator+(&local_110,(caffeLayer->name_).ptr_,"_Bias");
      convertCaffeMetadata
                (&local_110,&topMulLayer,&top,layerParameters.nnWrite,
                 layerParameters.mappingDataBlobNames);
      std::__cxx11::string::~string((string *)&local_110);
      this = CoreML::Specification::NeuralNetworkLayer::mutable_bias(pNVar14);
      plVar7 = biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar17 = (uint64 *)
                     biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar17 != (uint64 *)plVar7;
          puVar17 = puVar17 + 1) {
        if ((long)*puVar17 < 0) {
          __assert_fail("dim >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                        ,0xf6,
                        "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        CoreML::Specification::BiasLayerParams::add_shape(this,*puVar17);
      }
      pWVar15 = CoreML::Specification::BiasLayerParams::mutable_bias(this);
      local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffff00000000;
      google::protobuf::RepeatedField<float>::Resize
                (&pWVar15->floatvalue_,(int)local_e8,(float *)&local_110);
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pTVar9->blobs_).super_RepeatedPtrFieldBase,0);
      google::protobuf::RepeatedField<float>::CopyFrom(&pWVar15->floatvalue_,&pTVar11->data_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&topMulLayer);
    }
    goto LAB_004787bd;
  }
  pRVar19 = &pTVar9->blobs_;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  pBVar12 = pTVar11->shape_;
  if (pBVar12 == (BlobShape *)0x0) {
    pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = (pBVar12->dim_).current_size_;
  new_size = 1;
  if (iVar8 != 0) {
    if (iVar8 == 1) {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,0);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      new_size = (int)scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar8 == 2) {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,0);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      lVar4 = scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,1);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      new_size = (int)lVar4 *
                 (int)scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
    }
    else if (iVar8 - 3U < 2) {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 - 3U);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      lVar4 = scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 + -2);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      lVar5 = scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&pRVar19->super_RepeatedPtrFieldBase,0);
      pBVar12 = pTVar11->shape_;
      if (pBVar12 == (BlobShape *)0x0) {
        pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)caffe::BlobShape::dim(pBVar12,iVar8 + -1);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&scaleShape,(long *)&local_110);
      new_size = (int)lVar4 * (int)lVar5 *
                 (int)scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
      if (iVar8 == 4) {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&pRVar19->super_RepeatedPtrFieldBase,0);
        pBVar12 = pTVar11->shape_;
        if (pBVar12 == (BlobShape *)0x0) {
          pBVar12 = (BlobShape *)&caffe::_BlobShape_default_instance_;
        }
        iVar13 = caffe::BlobShape::dim(pBVar12,0);
        if (iVar13 != 1) {
          std::__cxx11::string::string((string *)&local_110,"scale",&local_111);
          psVar2 = (caffeLayer->name_).ptr_;
          psVar3 = (caffeLayer->type_).ptr_;
          std::__cxx11::string::string
                    ((string *)&topMulLayer,"4D scale only supported when 1st dimension is 1",
                     &local_e9);
          unsupportedCaffeParrameterWithOption(&local_110,psVar2,psVar3,(string *)&topMulLayer);
          goto LAB_00478625;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_110,"scale",&local_111);
      psVar2 = (caffeLayer->name_).ptr_;
      psVar3 = (caffeLayer->type_).ptr_;
      std::__cxx11::string::string((string *)&topMulLayer,">4D scale not supported",&local_e9);
      unsupportedCaffeParrameterWithOption(&local_110,psVar2,psVar3,(string *)&topMulLayer);
LAB_00478625:
      std::__cxx11::string::~string((string *)&topMulLayer);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  if ((pTVar11->data_).current_size_ != new_size) {
    std::__cxx11::string::string
              ((string *)&local_110,"Scale blob data size inconsistent with the  blob dimensions",
               (allocator *)&topMulLayer);
    errorInCaffeProto(&local_110,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_110);
  }
  pNVar14 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (layerParameters.nnWrite);
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,pTVar10);
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_scale(pNVar14);
  plVar7 = scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar17 = (uint64 *)
                 scaleShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar17 != (uint64 *)plVar7;
      puVar17 = puVar17 + 1) {
    if ((long)*puVar17 < 0) {
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                    ,0xd4,
                    "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                   );
    }
    CoreML::Specification::ScaleLayerParams::add_shapescale(this_00,*puVar17);
  }
  pWVar15 = CoreML::Specification::ScaleLayerParams::mutable_scale(this_00);
  local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffff00000000;
  google::protobuf::RepeatedField<float>::Resize(&pWVar15->floatvalue_,new_size,(float *)&local_110)
  ;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  google::protobuf::RepeatedField<float>::CopyFrom(&pWVar15->floatvalue_,&pTVar11->data_);
  plVar7 = biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (bVar1 != false) {
    this_00->hasbias_ = true;
    for (puVar17 = (uint64 *)
                   biasShape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar17 != (uint64 *)plVar7;
        puVar17 = puVar17 + 1) {
      if ((long)*puVar17 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Scale.cpp"
                      ,0xdd,
                      "void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      CoreML::Specification::ScaleLayerParams::add_shapebias(this_00,*puVar17);
    }
    pWVar15 = CoreML::Specification::ScaleLayerParams::mutable_bias(this_00);
    local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffff00000000;
    google::protobuf::RepeatedField<float>::Resize
              (&pWVar15->floatvalue_,(int)local_e8,(float *)&local_110);
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                        (&pRVar19->super_RepeatedPtrFieldBase,1);
    google::protobuf::RepeatedField<float>::CopyFrom(&pWVar15->floatvalue_,&pTVar11->data_);
  }
LAB_004787bd:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&scaleShape.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&biasShape.super__Vector_base<long,_std::allocator<long>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeScale(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    const caffe::ScaleParameter& caffeLayerParams =  caffeLayer.scale_param();
    
    #pragma unused(caffeLayerWeights)
    
    /* CoreML Scale layer does not support all the functionality of Caffe Scale layer.
     Certain error modes can only be detected at compile time when we have input shapes available.
     Such errors cannot be detected at conversion time.
     */
    if (caffeLayer.bottom_size() == 2){
        /*
        WARNING: Caffe Scale layer is currently not fully supported in CoreML.
        Conversion will proceed but certain modes exercised in Caffe may lead to error during compilation/runtime.
        Please refer to the CoreML documentation to see what is supported.
         */
    }
    
    /*
     Caffe can have scale as either an additional input or as a learned parameter. If former, there will be 2 bottoms,
     otherwise 1.
     if bottom_size == 1 => add an CoreML "scale" layer
     if bottom_size == 2 => add an MLkit "multiply" layer. If bias term is true then add another CoreML "bias" layer as well.
     */
   
    if (! (caffeLayer.bottom_size() == 1 || caffeLayer.bottom_size() == 2)){
        CoreMLConverter::errorInCaffeProto("Must have 1 or 2 input(s)",caffeLayer.name(),caffeLayer.type());
    }
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    auto* nnWrite = layerParameters.nnWrite;
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    
    int nBottom = caffeLayer.bottom_size();
    bool biasTerm = caffeLayerParams.bias_term();
    
    int biasLocation = 0;
    if (biasTerm) {
        if (nBottom == 1){
            biasLocation = 1;
        }
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if ((nBottom == 1 && !biasTerm) || (nBottom == 2 && biasTerm)){
        if (caffeLayerWeights.blobs_size() != 1){
            CoreMLConverter::errorInCaffeProto("There must be 1 weight blob",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (nBottom == 1 && biasTerm){
        if (caffeLayerWeights.blobs_size() != 2){
            CoreMLConverter::errorInCaffeProto("There must be 2 weight blobs",caffeLayer.name(),caffeLayer.type());
        }
    }
    if (caffeLayerParams.axis() == 0 || caffeLayerParams.axis() == -4 ||
        caffeLayerParams.axis() == 3 || caffeLayerParams.axis() == -1 ) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),
                                                             std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Scale of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 1 || caffeLayerParams.axis() == -3){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 2){
                CoreMLConverter::errorInCaffeProto("Bias of size 2D when axis = 1 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (nBottom == 1){
            if (caffeLayerWeights.blobs(0).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Scale of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    if (caffeLayerParams.axis() == 2 || caffeLayerParams.axis() == -2){
        if (biasTerm){
            if (caffeLayerWeights.blobs(biasLocation).shape().dim_size() == 1){
                CoreMLConverter::errorInCaffeProto("Bias of size 1D when axis = 2 is currently not supported",
                                                  caffeLayer.name(),caffeLayer.type());
            }
        }
    }
    //***************************************************************
    
    /*
     Get params related to the bias
     */
    std::vector<int64_t> biasShape;
    int biasSize = 1;
    if (biasTerm) {

        int dimSize = caffeLayerWeights.blobs(biasLocation).shape().dim_size();
        
        if (dimSize == 0){
            biasSize = 1;
        } else if (dimSize == 1){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
        } else if (dimSize == 2){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(0));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(1));
            biasSize *= biasShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-3));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-2));
            biasSize *= biasShape.back();
            biasShape.push_back(caffeLayerWeights.blobs(biasLocation).shape().dim(dimSize-1));
            biasSize *= biasShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(biasLocation).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D bias only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("bias",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D bias not supported");
        }
        if (caffeLayerWeights.blobs(biasLocation).data_size() != biasSize){
            CoreMLConverter::errorInCaffeProto("Bias blob data inconsistent with the blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Get params related to scale when it is a learned parameter
     */
    std::vector<int64_t> scaleShape;
    int scaleSize = 1;
    if (nBottom == 1) {
        
        int dimSize = caffeLayerWeights.blobs(0).shape().dim_size();
        
        if (dimSize == 0){
            scaleSize = 1;
        } else if (dimSize == 1){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 2){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(0));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(1));
            scaleSize *= scaleShape.back();
        } else if (dimSize == 3 || dimSize == 4){
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-3));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-2));
            scaleSize *= scaleShape.back();
            scaleShape.push_back(caffeLayerWeights.blobs(0).shape().dim(dimSize-1));
            scaleSize *= scaleShape.back();
            if (dimSize == 4 && caffeLayerWeights.blobs(0).shape().dim(0) != 1) {
                CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                     "4D scale only supported when 1st dimension is 1");
            }
        } else {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("scale",caffeLayer.name(),caffeLayer.type(),
                                                                 ">4D scale not supported");
        }
        if (caffeLayerWeights.blobs(0).data_size() != scaleSize){
            CoreMLConverter::errorInCaffeProto("Scale blob data size inconsistent with the  blob dimensions",caffeLayer.name(),caffeLayer.type());
        }
    }
    
    /*
     Add appropriate CoreML layer(s) now
     */
    
    if (nBottom == 1){
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::ScaleLayerParams* specLayerParams = specLayer->mutable_scale();
        for (const auto& dim: scaleShape){
            assert(dim >= 0);
            specLayerParams->add_shapescale(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* scaleWrite = specLayerParams->mutable_scale()->mutable_floatvalue();
        scaleWrite->Resize(scaleSize, 0.0);
        scaleWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
        if (biasTerm) {
            specLayerParams->set_hasbias(true);
            for (const auto& dim: biasShape){
                assert(dim >= 0);
                specLayerParams->add_shapebias(static_cast<uint64_t>(dim));
            }
            ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
            biasWrite->Resize(biasSize, 0.0);
            biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
        }
    } else if (biasTerm) {
        Specification::NeuralNetworkLayer* specLayerMul = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        std::vector<std::string> topMulLayer;
        topMulLayer.push_back(caffeLayer.name() + "_Mul_output");
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul",
                                             bottom, topMulLayer,
                                             nnWrite, mappingDataBlobNames);
        
        (void) specLayerMul->mutable_multiply();
        Specification::NeuralNetworkLayer* specLayerBias = nnWrite->Add();
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Bias",
                                             topMulLayer, top,
                                             nnWrite, mappingDataBlobNames);
        
        Specification::BiasLayerParams* specLayerParamsBias = specLayerBias->mutable_bias();
        for (const auto& dim: biasShape){
            assert(dim >= 0);
            specLayerParamsBias->add_shape(static_cast<uint64_t>(dim));
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParamsBias->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize(biasSize, 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    } else {
        Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
        bottom.push_back(caffeLayer.bottom(0));
        bottom.push_back(caffeLayer.bottom(1));
        CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_Mul", 
                                             bottom, top,
                                             nnWrite, mappingDataBlobNames);
        (void) specLayer->mutable_multiply();
    }
}